

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v6::detail::buffer<char>_>
fmt::v6::detail::
write_padded<(fmt::v6::align::type)2,std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,fmt::v6::detail::float_writer<char>>
          (back_insert_iterator<fmt::v6::detail::buffer<char>_> out,basic_format_specs<char> *specs,
          size_t size,size_t width,float_writer<char> *f)

{
  basic_format_specs<char> *it_00;
  type tVar1;
  ulong n;
  size_t sVar2;
  checked_ptr<typename_buffer<char>::value_type> it_01;
  char *pcVar3;
  back_insert_iterator<fmt::v6::detail::buffer<char>_> bVar4;
  ulong local_70;
  checked_ptr<typename_buffer<char>::value_type> it;
  size_t left_padding;
  char *shifts;
  size_t padding;
  uint spec_width;
  float_writer<char> *f_local;
  size_t width_local;
  size_t size_local;
  basic_format_specs<char> *specs_local;
  back_insert_iterator<fmt::v6::detail::buffer<char>_> out_local;
  
  specs_local = (basic_format_specs<char> *)out.container;
  tVar1 = to_unsigned<int>(specs->width);
  it_00 = specs_local;
  if (width < tVar1) {
    local_70 = tVar1 - width;
  }
  else {
    local_70 = 0;
  }
  n = local_70 >>
      (*(byte *)((long)&basic_data<void>::right_padding_shifts + (ulong)(specs->field_0x9 & 0xf)) &
      0x3f);
  sVar2 = fill_t<char>::size(&specs->fill);
  it_01 = reserve<fmt::v6::detail::buffer<char>,_0>
                    ((back_insert_iterator<fmt::v6::detail::buffer<char>_>)it_00,
                     size + local_70 * sVar2);
  pcVar3 = fill<char*,char>(it_01,n,&specs->fill);
  pcVar3 = float_writer<char>::operator()(f,pcVar3);
  pcVar3 = fill<char*,char>(pcVar3,local_70 - n,&specs->fill);
  bVar4 = base_iterator<fmt::v6::detail::buffer<char>,_0>
                    ((back_insert_iterator<fmt::v6::detail::buffer<char>_> *)&specs_local,pcVar3);
  return (back_insert_iterator<fmt::v6::detail::buffer<char>_>)bVar4.container;
}

Assistant:

inline OutputIt write_padded(OutputIt out,
                             const basic_format_specs<Char>& specs, size_t size,
                             size_t width, const F& f) {
  static_assert(align == align::left || align == align::right, "");
  unsigned spec_width = to_unsigned(specs.width);
  size_t padding = spec_width > width ? spec_width - width : 0;
  auto* shifts = align == align::left ? data::left_padding_shifts
                                      : data::right_padding_shifts;
  size_t left_padding = padding >> shifts[specs.align];
  auto it = reserve(out, size + padding * specs.fill.size());
  it = fill(it, left_padding, specs.fill);
  it = f(it);
  it = fill(it, padding - left_padding, specs.fill);
  return base_iterator(out, it);
}